

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O1

bool __thiscall re2::Prog::IsOnePass(Prog *this)

{
  int iVar1;
  byte bVar2;
  Inst *pIVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  int *__s;
  int *__src;
  uint8 *__dest;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  int *piVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar20;
  size_t sVar21;
  char cVar22;
  long lVar23;
  uint *puVar24;
  byte bVar25;
  Instq workq;
  Instq tovisit;
  uint local_23c;
  ostringstream *local_228;
  ulong local_210;
  int local_1f0;
  SparseSet local_1e8;
  SparseSet local_1d0;
  int *local_1b8;
  LogMessage local_1b0;
  ostringstream *poVar19;
  
  if (this->did_onepass_ == true) {
    bVar25 = this->onepass_start_ != (OneState *)0x0;
    goto LAB_0012c595;
  }
  this->did_onepass_ = true;
  if ((this->start_ != 0) && ((long)this->inst_count_[2] < 0xfde6)) {
    lVar23 = (long)this->inst_count_[2] + 2;
    lVar15 = this->dfa_mem_;
    lVar10 = lVar15 + 3;
    if (-1 < lVar15) {
      lVar10 = lVar15;
    }
    iVar1 = this->bytemap_range_ * 4 + 4;
    poVar19 = (ostringstream *)0x0;
    bVar25 = 0;
    lVar15 = (long)iVar1;
    auVar4._8_8_ = lVar10 >> 0x3f;
    auVar4._0_8_ = lVar10 >> 2;
    if (lVar23 <= SUB168(auVar4 / SEXT816(lVar15),0)) {
      lVar10 = (long)this->inst_count_[6] + (long)this->inst_count_[4] + (long)this->inst_count_[3];
      uVar20 = lVar10 * 8 + 8;
      if ((int)lVar10 < -1) {
        uVar20 = 0xffffffffffffffff;
      }
      piVar11 = (int *)operator_new__(uVar20);
      iVar13 = this->size_;
      sVar21 = (long)iVar13 * 4;
      uVar20 = 0xffffffffffffffff;
      if (-1 < (long)iVar13) {
        uVar20 = sVar21;
      }
      __s = (int *)operator_new__(uVar20);
      memset(__s,0xff,sVar21);
      local_1f0 = (int)lVar23;
      iVar12 = -1;
      if (-1 < iVar1 * local_1f0) {
        iVar12 = iVar1 * local_1f0;
      }
      __src = (int *)operator_new__((long)iVar12);
      SparseSet::SparseSet(&local_1d0,iVar13);
      SparseSet::SparseSet(&local_1e8,iVar13);
      AddQ(&local_1d0,this->start_);
      __s[this->start_] = 0;
      cVar22 = '\x02';
      if (local_1d0.size_ == 0) {
        local_228._0_4_ = 1;
      }
      else {
        local_228 = (ostringstream *)0x1;
        piVar16 = local_1d0.dense_;
        do {
          iVar13 = *piVar16;
          puVar24 = (uint *)(__s[iVar13] * lVar15 + (long)__src);
          iVar12 = this->bytemap_range_;
          if (0 < (long)iVar12) {
            lVar10 = 0;
            do {
              puVar24[lVar10 + 1] = 0x30;
              lVar10 = lVar10 + 1;
            } while (iVar12 != lVar10);
          }
          *puVar24 = 0x30;
          local_1e8.size_ = 0;
          *piVar11 = iVar13;
          bVar5 = false;
          piVar11[1] = 0;
          local_210 = 1;
          local_1b8 = piVar16;
          do {
            local_210 = (ulong)((int)local_210 - 1);
            uVar7 = piVar11[local_210 * 2];
            local_23c = piVar11[local_210 * 2 + 1];
            do {
              pIVar3 = this->inst_;
              uVar18 = pIVar3[(int)uVar7].out_opcode_;
              cVar22 = '\0';
              switch(uVar18 & 7) {
              case 0:
                LogMessage::LogMessage
                          (&local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/onepass.cc"
                           ,0x1b4,3);
                poVar19 = &local_1b0.str_;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar19,"unhandled opcode: ",0x12);
                std::ostream::operator<<((ostream *)poVar19,pIVar3[(int)uVar7].out_opcode_ & 7);
                LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
                cVar22 = '\0';
                break;
              case 1:
                if ((uVar18 & 8) != 0) {
                  __assert_fail("!ip->last()",
                                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/onepass.cc"
                                ,0x1ba,"bool re2::Prog::IsOnePass()");
                }
LAB_0012c89d:
                uVar18 = uVar7 + 1;
                bVar6 = AddQ(&local_1e8,uVar18);
                if (bVar6) {
                  uVar7 = uVar18;
                }
                poVar19 = (ostringstream *)(ulong)uVar18;
                cVar22 = !bVar6 * '\x02' + '\n';
                break;
              case 2:
                poVar19 = local_228;
                iVar13 = __s[uVar18 >> 4];
                if (__s[uVar18 >> 4] == -1) {
                  cVar22 = '\f';
                  if ((int)local_228 < local_1f0) {
                    __s[uVar18 >> 4] = (int)local_228;
                    AddQ(&local_1d0,pIVar3[(int)uVar7].out_opcode_ >> 4);
                    poVar19 = (ostringstream *)(ulong)((int)local_228 + 1);
                    iVar13 = (int)local_228;
                    goto LAB_0012c900;
                  }
                }
                else {
LAB_0012c900:
                  local_228._0_4_ = iVar13;
                  if ((pIVar3[(int)uVar7].out_opcode_ & 7) != 2) {
                    __assert_fail("(opcode()) == (kInstByteRange)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                                  ,0x6f,"int re2::Prog::Inst::lo()");
                  }
                  if ((pIVar3[(int)uVar7].out_opcode_ & 7) != 2) {
LAB_0012cc36:
                    __assert_fail("(opcode()) == (kInstByteRange)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                                  ,0x70,"int re2::Prog::Inst::hi()");
                  }
                  uVar14 = (uint)pIVar3[(int)uVar7].field_1.field_3.lo_;
                  uVar18 = (int)local_228 << 0x10 | local_23c;
                  uVar17 = uVar18;
                  if (bVar5) {
                    uVar17 = uVar18 | 0x40;
                  }
                  while ((int)uVar14 <= (int)(uint)pIVar3[(int)uVar7].field_1.field_3.hi_) {
                    bVar25 = this->bytemap_[(int)uVar14];
                    iVar13 = uVar14 - 1;
                    lVar10 = (long)(int)uVar14;
                    do {
                      if (lVar10 == 0xff) {
                        iVar13 = 0xff;
                        break;
                      }
                      iVar13 = iVar13 + 1;
                      lVar23 = lVar10 + 1;
                      lVar10 = lVar10 + 1;
                    } while (this->bytemap_[lVar23] == bVar25);
                    if ((~puVar24[(ulong)bVar25 + 1] & 0x30) == 0) {
                      puVar24[(ulong)bVar25 + 1] = uVar17;
LAB_0012c998:
                      cVar22 = '\0';
                      bVar6 = true;
                    }
                    else {
                      if (puVar24[(ulong)bVar25 + 1] == uVar17) goto LAB_0012c998;
                      cVar22 = '\f';
                      bVar6 = false;
                    }
                    if (!bVar6) goto LAB_0012c9c6;
                    uVar14 = iVar13 + 1;
                    if ((pIVar3[(int)uVar7].out_opcode_ & 7) != 2) goto LAB_0012cc36;
                  }
                  cVar22 = '\r';
LAB_0012c9c6:
                  local_228 = poVar19;
                  if (cVar22 == '\r') {
                    if ((pIVar3[(int)uVar7].out_opcode_ & 7) != 2) {
                      __assert_fail("(opcode()) == (kInstByteRange)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                                    ,0x71,"int re2::Prog::Inst::foldcase()");
                    }
                    if (pIVar3[(int)uVar7].field_1.field_3.foldcase_ != '\0') {
                      uVar17 = pIVar3[(int)uVar7].field_1.out1_;
                      if ((byte)pIVar3[(int)uVar7].field_1.out1_ < 0x62) {
                        uVar17 = 0x61;
                      }
                      bVar25 = pIVar3[(int)uVar7].field_1.field_3.hi_;
                      if (0x79 < bVar25) {
                        bVar25 = 0x7a;
                      }
                      if ((byte)uVar17 <= bVar25) {
                        iVar13 = (uVar17 & 0xff) - 0x20;
                        if (bVar5) {
                          uVar18 = uVar18 | 0x40;
                        }
                        do {
                          bVar2 = this->bytemap_[iVar13];
                          iVar12 = 0xff;
                          if (0xff < iVar13) {
                            iVar12 = iVar13;
                          }
                          iVar8 = iVar13 + -1;
                          lVar10 = (long)iVar13;
                          do {
                            iVar9 = iVar12;
                            if (0xfe < lVar10) break;
                            iVar8 = iVar8 + 1;
                            lVar23 = lVar10 + 1;
                            lVar10 = lVar10 + 1;
                            iVar9 = iVar8;
                          } while (this->bytemap_[lVar23] == bVar2);
                          if ((~puVar24[(ulong)bVar2 + 1] & 0x30) == 0) {
                            puVar24[(ulong)bVar2 + 1] = uVar18;
LAB_0012ca80:
                            cVar22 = '\0';
                            bVar6 = true;
                          }
                          else {
                            if (puVar24[(ulong)bVar2 + 1] == uVar18) goto LAB_0012ca80;
                            cVar22 = '\f';
                            bVar6 = false;
                          }
                          if (!bVar6) goto LAB_0012caa0;
                          iVar13 = iVar9 + 1;
                        } while (iVar9 < (int)(bVar25 - 0x20));
                      }
                      cVar22 = '\x12';
LAB_0012caa0:
                      if (cVar22 != '\x12') goto LAB_0012caf3;
                    }
                    cVar22 = '\v';
                    if ((pIVar3[(int)uVar7].out_opcode_ & 8) == 0) {
                      bVar6 = AddQ(&local_1e8,uVar7 + 1);
                      if (bVar6) {
                        uVar7 = uVar7 + 1;
                      }
                      cVar22 = !bVar6 * '\x02' + '\n';
                    }
                  }
                }
LAB_0012caf3:
                poVar19 = local_228;
                if (cVar22 == '\v') {
                  cVar22 = '\0';
                }
                break;
              default:
                if ((uVar18 & 8) == 0) {
                  uVar18 = uVar7 + 1;
                  poVar19 = (ostringstream *)(ulong)uVar18;
                  bVar6 = AddQ(&local_1e8,uVar18);
                  cVar22 = '\f';
                  if (!bVar6) break;
                  lVar10 = (long)(int)local_210;
                  piVar11[lVar10 * 2] = uVar18;
                  local_210 = (ulong)((int)local_210 + 1);
                  piVar11[lVar10 * 2 + 1] = local_23c;
                }
                uVar18 = pIVar3[(int)uVar7].out_opcode_ & 7;
                if ((uVar18 == 3) && (pIVar3[(int)uVar7].field_1.cap_ < 10)) {
                  local_23c = local_23c | 0x20 << ((byte)pIVar3[(int)uVar7].field_1.cap_ & 0x1f);
                }
                if (uVar18 == 4) {
                  local_23c = local_23c | pIVar3[(int)uVar7].field_1.out1_;
                }
                bVar6 = AddQ(&local_1e8,pIVar3[(int)uVar7].out_opcode_ >> 4);
                cVar22 = '\f';
                if (bVar6) {
                  uVar7 = pIVar3[(int)uVar7].out_opcode_ >> 4;
                  cVar22 = '\n';
                }
                break;
              case 5:
                if (bVar5) {
                  cVar22 = '\f';
                }
                else {
                  *puVar24 = local_23c;
                  bVar5 = true;
                  cVar22 = '\0';
                  if ((pIVar3[(int)uVar7].out_opcode_ & 8) == 0) goto LAB_0012c89d;
                }
                break;
              case 7:
                break;
              }
              bVar25 = (byte)poVar19;
            } while (cVar22 == '\n');
            if (cVar22 != '\0') goto LAB_0012cb2b;
          } while (0 < (int)local_210);
          cVar22 = '\0';
LAB_0012cb2b:
          if (cVar22 != '\0') goto LAB_0012cb79;
          piVar16 = local_1b8 + 1;
        } while (piVar16 != local_1d0.dense_ + local_1d0.size_);
        cVar22 = '\x02';
      }
LAB_0012cb79:
      if (cVar22 == '\f') {
        operator_delete__(piVar11);
        bVar25 = 0;
        piVar11 = __s;
LAB_0012cc10:
        operator_delete__(piVar11);
        operator_delete__(__src);
      }
      else if (cVar22 == '\x02') {
        sVar21 = (size_t)((int)local_228 * iVar1);
        uVar20 = 0xffffffffffffffff;
        if (-1 < (int)local_228 * iVar1) {
          uVar20 = sVar21;
        }
        __dest = (uint8 *)operator_new__(uVar20);
        memcpy(__dest,__src,sVar21);
        operator_delete__(__src);
        this->onepass_start_ = (OneState *)(__dest + __s[this->start_] * lVar15);
        this->onepass_nodes_ = __dest;
        this->onepass_statesize_ = iVar1;
        this->dfa_mem_ = this->dfa_mem_ - sVar21;
        bVar25 = 1;
        __src = __s;
        goto LAB_0012cc10;
      }
      SparseSet::~SparseSet(&local_1e8);
      SparseSet::~SparseSet(&local_1d0);
      goto LAB_0012c595;
    }
  }
  bVar25 = 0;
LAB_0012c595:
  return (bool)(bVar25 & 1);
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_start_ != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(OneState) + bytemap_range_*sizeof(uint32);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  InstCond* stack = new InstCond[stacksize];

  int size = this->size();
  int* nodebyid = new int[size];  // indexed by ip
  memset(nodebyid, 0xFF, size*sizeof nodebyid[0]);

  uint8* nodes = new uint8[maxnodes*statesize];
  uint8* nodep = nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  nodep += statesize;
  int nalloc = 1;
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes, statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32 cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              if (Debug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: hit node limit %d > %d", nalloc, maxnodes);
              goto fail;
            }
            nextindex = nalloc;
            nodep += statesize;
            nodebyid[ip->out()] = nextindex;
            nalloc++;
            AddQ(&tovisit, ip->out());
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32 act = node->action[b];
            uint32 newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              if (Debug) {
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: conflict on byte %#x at state %d", c, *it);
              }
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32 act = node->action[b];
              uint32 newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                if (Debug) {
                  LOG(ERROR) << StringPrintf(
                      "Not OnePass: conflict on byte %#x at state %d", c, *it);
                }
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            if (Debug) {
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple paths %d -> %d\n", *it, ip->out());
            }
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            if (Debug) {
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple matches from %d\n", *it);
            }
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  if (Debug) {  // For debugging, dump one-pass NFA to LOG(ERROR).
    LOG(ERROR) << "bytemap:\n" << DumpByteMap();
    LOG(ERROR) << "prog:\n" << Dump();

    map<int, int> idmap;
    for (int i = 0; i < size; i++)
      if (nodebyid[i] != -1)
        idmap[nodebyid[i]] = i;

    string dump;
    for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
      int id = *it;
      int nodeindex = nodebyid[id];
      if (nodeindex == -1)
        continue;
      OneState* node = IndexToNode(nodes, statesize, nodeindex);
      StringAppendF(&dump, "node %d id=%d: matchcond=%#x\n",
                    nodeindex, id, node->matchcond);
      for (int i = 0; i < bytemap_range_; i++) {
        if ((node->action[i] & kImpossible) == kImpossible)
          continue;
        StringAppendF(&dump, "  %d cond %#x -> %d id=%d\n",
                      i, node->action[i] & 0xFFFF,
                      node->action[i] >> kIndexShift,
                      idmap[node->action[i] >> kIndexShift]);
      }
    }
    LOG(ERROR) << "nodes:\n" << dump;
  }

  // Overallocated earlier; cut down to actual size.
  nodep = new uint8[nalloc*statesize];
  memmove(nodep, nodes, nalloc*statesize);
  delete[] nodes;
  nodes = nodep;

  onepass_start_ = IndexToNode(nodes, statesize, nodebyid[start()]);
  onepass_nodes_ = nodes;
  onepass_statesize_ = statesize;
  dfa_mem_ -= nalloc*statesize;

  delete[] stack;
  delete[] nodebyid;
  return true;

fail:
  delete[] stack;
  delete[] nodebyid;
  delete[] nodes;
  return false;
}